

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MacroActualArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroActualArgumentSyntax,std::span<slang::parsing::Token,18446744073709551615ul>>
          (BumpAllocator *this,span<slang::parsing::Token,_18446744073709551615UL> *args)

{
  MacroActualArgumentSyntax *this_00;
  span<slang::parsing::Token,_18446744073709551615UL> *in_RSI;
  TokenList *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  this_00 = (MacroActualArgumentSyntax *)
            allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  slang::syntax::TokenList::TokenList((TokenList *)this_00,*in_RSI);
  slang::syntax::MacroActualArgumentSyntax::MacroActualArgumentSyntax
            (this_00,in_stack_ffffffffffffff98);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }